

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int act_lookup(char *name)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *bstr;
  int iVar5;
  flag_type *pfVar6;
  
  bstr = "npc";
  pfVar6 = act_flags;
  iVar4 = 0;
  while( true ) {
    pfVar6 = pfVar6 + 1;
    cVar1 = *name;
    iVar3 = cVar1 + 0x20;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      iVar3 = (int)cVar1;
    }
    cVar1 = *bstr;
    iVar5 = cVar1 + 0x20;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      iVar5 = (int)cVar1;
    }
    if ((iVar3 == iVar5) && (bVar2 = str_prefix(name,bstr), !bVar2)) break;
    bstr = pfVar6->name;
    iVar4 = iVar4 + 1;
    if (bstr == (char *)0x0) {
      return -1;
    }
  }
  return iVar4;
}

Assistant:

int act_lookup(const char *name)
{
	int act;

	// TODO: change act_flags from array to vector. requires detailed refactoring.
	for (act = 0; act_flags[act].name != nullptr; act++)
	{
		if (LOWER(name[0]) == LOWER(act_flags[act].name[0]) && !str_prefix(name, act_flags[act].name))
			return act;
	}

	return -1;
}